

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O2

void __thiscall libtorrent::portmap_alert::~portmap_alert(portmap_alert *this)

{
  operator_delete(this,0x40);
  return;
}

Assistant:

struct TORRENT_EXPORT portmap_alert final : alert
	{
		// internal
		TORRENT_UNEXPORT portmap_alert(aux::stack_allocator& alloc, port_mapping_t i, int port
			, portmap_transport t, portmap_protocol protocol, address const& local);

		TORRENT_DEFINE_ALERT(portmap_alert, 51)

		static inline constexpr alert_category_t static_category = alert_category::port_mapping;
		std::string message() const override;

		// refers to the mapping index of the port map that failed, i.e.
		// the index returned from add_mapping().
		port_mapping_t const mapping;

		// the external port allocated for the mapping.
		int const external_port;

		portmap_protocol const map_protocol;

		portmap_transport const map_transport;

		// the local network the port mapper is running on
		aux::noexcept_movable<address> local_address;

#if TORRENT_ABI_VERSION == 1
		enum TORRENT_DEPRECATED_ENUM protocol_t
		{
			tcp,
			udp
		};

		// the protocol this mapping was for. one of protocol_t enums
		TORRENT_DEPRECATED int const protocol;

		// 0 for NAT-PMP and 1 for UPnP.
		TORRENT_DEPRECATED int const map_type;
#endif
	}